

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O2

void h2o_delegate_request(h2o_req_t *req,h2o_handler_t *current_handler)

{
  h2o_handler_t **pphVar1;
  size_t sVar2;
  h2o_handler_t *phVar3;
  h2o_handler_t **handler;
  long lVar4;
  h2o_handler_t **pphVar5;
  
  pphVar1 = (req->pathconf->handlers).entries;
  sVar2 = (req->pathconf->handlers).size;
  lVar4 = sVar2 << 3;
  pphVar5 = pphVar1;
  do {
    handler = pphVar1 + sVar2;
    if (lVar4 == 0) break;
    handler = pphVar5 + 1;
    lVar4 = lVar4 + -8;
    phVar3 = *pphVar5;
    pphVar5 = handler;
  } while (phVar3 != current_handler);
  call_handlers(req,handler);
  return;
}

Assistant:

void h2o_delegate_request(h2o_req_t *req, h2o_handler_t *current_handler)
{
    h2o_handler_t **handler = req->pathconf->handlers.entries, **end = handler + req->pathconf->handlers.size;

    for (; handler != end; ++handler) {
        if (*handler == current_handler) {
            ++handler;
            break;
        }
    }
    call_handlers(req, handler);
}